

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_encode(uchar **out,size_t *outsize,uchar *image,uint w,uint h,LodePNGState *state)

{
  char *pcVar1;
  size_t sVar2;
  char **ppcVar3;
  char **ppcVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uchar *out_00;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  LodePNGEncoderSettings *pLVar11;
  ucvector outv;
  uchar *data;
  size_t datasize;
  LodePNGInfo info;
  ucvector local_178;
  LodePNGEncoderSettings *local_158;
  char **local_150;
  char **local_148;
  uchar *local_140;
  size_t local_138;
  LodePNGColorMode *local_130;
  uchar **local_128;
  size_t *local_120;
  LodePNGInfo local_118;
  
  local_140 = (uchar *)0x0;
  local_138 = 0;
  *out = (uchar *)0x0;
  *outsize = 0;
  state->error = 0;
  local_118.color.key_defined = 0;
  local_118.color.key_r = 0;
  local_118.color.key_g = 0;
  local_118.color.key_b = 0;
  local_118.color.colortype = LCT_RGBA;
  local_118.color.bitdepth = 8;
  local_118.color.palette = (uchar *)0x0;
  local_118.color.palettesize = 0;
  local_118.interlace_method = 0;
  local_118.compression_method = 0;
  local_118.filter_method = 0;
  local_118.phys_defined = 0;
  local_118.unknown_chunks_data[0] = (uchar *)0x0;
  local_118.unknown_chunks_data[1] = (uchar *)0x0;
  local_118.unknown_chunks_data[2] = (uchar *)0x0;
  local_118.unknown_chunks_size[0] = 0;
  local_118.unknown_chunks_size[1] = 0;
  local_118.unknown_chunks_size[2] = 0;
  local_118.background_defined = 0;
  local_118.background_r = 0;
  local_118.background_g = 0;
  local_118.background_b = 0;
  local_118.text_num = 0;
  local_118.text_keys = (char **)0x0;
  local_118.text_strings = (char **)0x0;
  local_118.itext_num = 0;
  local_118.itext_keys = (char **)0x0;
  local_118.itext_langtags = (char **)0x0;
  local_118.itext_transkeys = (char **)0x0;
  local_118.itext_strings = (char **)0x0;
  local_118.time_defined = 0;
  local_120 = outsize;
  lodepng_info_copy(&local_118,&state->info_png);
  if (((local_118.color.colortype == LCT_PALETTE) || ((state->encoder).force_palette != 0)) &&
     (local_118.color.palettesize - 0x101 < 0xffffffffffffff00)) {
    state->error = 0x44;
    return 0x44;
  }
  if ((state->encoder).auto_convert == 0) {
    uVar5 = state->error;
  }
  else {
    uVar5 = lodepng_auto_choose_color(&local_118.color,image,w,h,&state->info_raw);
    state->error = uVar5;
  }
  if (uVar5 != 0) {
    return uVar5;
  }
  pLVar11 = &state->encoder;
  if (2 < (pLVar11->zlibsettings).btype) {
    state->error = 0x3d;
    return 0x3d;
  }
  if (1 < (state->info_png).interlace_method) {
    state->error = 0x47;
    return 0x47;
  }
  local_150 = (char **)(local_118.color._0_8_ & 0xffffffff);
  uVar5 = local_118.color.bitdepth;
  local_128 = out;
  uVar6 = checkColorValidity(local_118.color.colortype,local_118.color.bitdepth);
  state->error = uVar6;
  if (uVar6 != 0) {
    return uVar6;
  }
  local_148 = (char **)CONCAT44(local_148._4_4_,uVar5);
  uVar5 = checkColorValidity((state->info_raw).colortype,(state->info_raw).bitdepth);
  state->error = uVar5;
  if (uVar5 != 0) {
    return uVar5;
  }
  iVar7 = lodepng_color_mode_equal(&state->info_raw,&local_118.color);
  if (iVar7 == 0) {
    iVar7 = 0;
    if ((uint)local_150 < 7) {
      iVar7 = *(int *)(&DAT_001328b4 + (long)local_150 * 4);
    }
    lVar10 = (ulong)(iVar7 * (uint)local_148) * (ulong)(h * w);
    local_158 = pLVar11;
    local_130 = &state->info_raw;
    out_00 = (uchar *)malloc(lVar10 + 7U >> 3);
    if (lVar10 == 0 || out_00 != (uchar *)0x0) {
      uVar5 = lodepng_convert(out_00,image,&local_118.color,local_130,w,h);
      pLVar11 = local_158;
      state->error = uVar5;
      if (uVar5 == 0) {
        preProcessScanlines(&local_140,&local_138,out_00,w,h,&local_118,local_158);
      }
    }
    else {
      state->error = 0x53;
      pLVar11 = local_158;
    }
    free(out_00);
  }
  else {
    preProcessScanlines(&local_140,&local_138,image,w,h,&local_118,pLVar11);
  }
  uVar5 = (uint)local_148;
  local_178.data = (uchar *)0x0;
  local_178.size = 0;
  local_178.allocsize = 0;
  if (state->error != 0) goto LAB_00126aea;
  local_158 = pLVar11;
  writeSignature(&local_178);
  pLVar11 = local_158;
  addChunk_IHDR(&local_178,w,h,(LodePNGColorType)local_150,uVar5,local_118.interlace_method);
  if (local_118.unknown_chunks_data[0] != (uchar *)0x0) {
    uVar5 = addUnknownChunks(&local_178,local_118.unknown_chunks_data[0],
                             local_118.unknown_chunks_size[0]);
    state->error = uVar5;
    if (uVar5 != 0) goto LAB_00126aea;
  }
  if ((uint)local_150 == 3) {
    addChunk_PLTE(&local_178,&local_118.color);
    uVar5 = getPaletteTranslucency(local_118.color.palette,local_118.color.palettesize);
joined_r0x00126bff:
    if (uVar5 != 0) {
      addChunk_tRNS(&local_178,&local_118.color);
    }
  }
  else {
    if ((((uint)local_150 & 0xfffffffb) == 2) && ((state->encoder).force_palette != 0)) {
      addChunk_PLTE(&local_178,&local_118.color);
    }
    if (((ulong)local_150 & 0xfffffffd) == 0) {
      uVar5 = local_118.color.key_defined;
      goto joined_r0x00126bff;
    }
  }
  if (local_118.background_defined != 0) {
    addChunk_bKGD(&local_178,&local_118);
  }
  if (local_118.phys_defined != 0) {
    addChunk_pHYs(&local_178,&local_118);
  }
  if (local_118.unknown_chunks_data[1] != (uchar *)0x0) {
    uVar5 = addUnknownChunks(&local_178,local_118.unknown_chunks_data[1],
                             local_118.unknown_chunks_size[1]);
    state->error = uVar5;
    if (uVar5 != 0) goto LAB_00126aea;
  }
  uVar5 = addChunk_IDAT(&local_178,local_140,local_138,&pLVar11->zlibsettings);
  state->error = uVar5;
  if (uVar5 != 0) goto LAB_00126aea;
  if (local_118.time_defined != 0) {
    addChunk_tIME(&local_178,&local_118.time);
  }
  ppcVar4 = local_118.text_strings;
  ppcVar3 = local_118.text_keys;
  sVar2 = local_118.text_num;
  if (local_118.text_num == 0) {
    if ((state->encoder).add_id != 0) goto LAB_00126d70;
  }
  else {
    sVar9 = 0;
    do {
      pcVar1 = ppcVar3[sVar9];
      sVar8 = strlen(pcVar1);
      if (0x4f < sVar8) {
        uVar5 = 0x42;
LAB_00126d32:
        state->error = uVar5;
        break;
      }
      if (sVar8 == 0) {
        uVar5 = 0x43;
        goto LAB_00126d32;
      }
      if ((state->encoder).text_compression == 0) {
        addChunk_tEXt(&local_178,pcVar1,ppcVar4[sVar9]);
      }
      else {
        addChunk_zTXt(&local_178,pcVar1,ppcVar4[sVar9],&local_158->zlibsettings);
      }
      sVar9 = sVar9 + 1;
    } while (sVar2 != sVar9);
    ppcVar3 = local_118.text_keys;
    if ((state->encoder).add_id != 0) {
      if (sVar2 != 0) {
        sVar9 = 0;
        do {
          iVar7 = strcmp(ppcVar3[sVar9],"LodePNG");
          if (iVar7 == 0) goto LAB_00126d88;
          sVar9 = sVar9 + 1;
        } while (sVar2 != sVar9);
      }
LAB_00126d70:
      addChunk_tEXt(&local_178,"LodePNG",LODEPNG_VERSION_STRING);
    }
  }
LAB_00126d88:
  ppcVar4 = local_118.itext_langtags;
  ppcVar3 = local_118.itext_keys;
  sVar2 = local_118.itext_num;
  if (local_118.itext_num != 0) {
    local_150 = local_118.itext_transkeys;
    local_148 = local_118.itext_strings;
    sVar9 = 0;
    do {
      pcVar1 = ppcVar3[sVar9];
      sVar8 = strlen(pcVar1);
      if (0x4f < sVar8) {
        uVar5 = 0x42;
LAB_00126e26:
        state->error = uVar5;
        break;
      }
      if (sVar8 == 0) {
        uVar5 = 0x43;
        goto LAB_00126e26;
      }
      addChunk_iTXt(&local_178,(state->encoder).text_compression,pcVar1,ppcVar4[sVar9],
                    local_150[sVar9],local_148[sVar9],&local_158->zlibsettings);
      sVar9 = sVar9 + 1;
    } while (sVar2 != sVar9);
  }
  if (local_118.unknown_chunks_data[2] != (uchar *)0x0) {
    uVar5 = addUnknownChunks(&local_178,local_118.unknown_chunks_data[2],
                             local_118.unknown_chunks_size[2]);
    state->error = uVar5;
    if (uVar5 != 0) goto LAB_00126aea;
  }
  lodepng_chunk_create(&local_178.data,&local_178.size,0,"IEND",(uchar *)0x0);
LAB_00126aea:
  lodepng_info_cleanup(&local_118);
  free(local_140);
  *local_128 = local_178.data;
  *local_120 = local_178.size;
  return state->error;
}

Assistant:

unsigned lodepng_encode(unsigned char** out, size_t* outsize,
                        const unsigned char* image, unsigned w, unsigned h,
                        LodePNGState* state)
{
  LodePNGInfo info;
  ucvector outv;
  unsigned char* data = 0; /*uncompressed version of the IDAT chunk data*/
  size_t datasize = 0;

  /*provide some proper output values if error will happen*/
  *out = 0;
  *outsize = 0;
  state->error = 0;

  lodepng_info_init(&info);
  lodepng_info_copy(&info, &state->info_png);

  if((info.color.colortype == LCT_PALETTE || state->encoder.force_palette)
      && (info.color.palettesize == 0 || info.color.palettesize > 256))
  {
    state->error = 68; /*invalid palette size, it is only allowed to be 1-256*/
    return state->error;
  }

  if(state->encoder.auto_convert)
  {
    state->error = lodepng_auto_choose_color(&info.color, image, w, h, &state->info_raw);
  }
  if(state->error) return state->error;

  if(state->encoder.zlibsettings.btype > 2)
  {
    CERROR_RETURN_ERROR(state->error, 61); /*error: unexisting btype*/
  }
  if(state->info_png.interlace_method > 1)
  {
    CERROR_RETURN_ERROR(state->error, 71); /*error: unexisting interlace mode*/
  }

  state->error = checkColorValidity(info.color.colortype, info.color.bitdepth);
  if(state->error) return state->error; /*error: unexisting color type given*/
  state->error = checkColorValidity(state->info_raw.colortype, state->info_raw.bitdepth);
  if(state->error) return state->error; /*error: unexisting color type given*/

  if(!lodepng_color_mode_equal(&state->info_raw, &info.color))
  {
    unsigned char* converted;
    size_t size = (w * h * (size_t)lodepng_get_bpp(&info.color) + 7) / 8;

    converted = (unsigned char*)lodepng_malloc(size);
    if(!converted && size) state->error = 83; /*alloc fail*/
    if(!state->error)
    {
      state->error = lodepng_convert(converted, image, &info.color, &state->info_raw, w, h);
    }
    if(!state->error) preProcessScanlines(&data, &datasize, converted, w, h, &info, &state->encoder);
    lodepng_free(converted);
  }
  else preProcessScanlines(&data, &datasize, image, w, h, &info, &state->encoder);

  ucvector_init(&outv);
  while(!state->error) /*while only executed once, to break on error*/
  {
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    size_t i;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*write signature and chunks*/
    writeSignature(&outv);
    /*IHDR*/
    addChunk_IHDR(&outv, w, h, info.color.colortype, info.color.bitdepth, info.interlace_method);
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*unknown chunks between IHDR and PLTE*/
    if(info.unknown_chunks_data[0])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[0], info.unknown_chunks_size[0]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*PLTE*/
    if(info.color.colortype == LCT_PALETTE)
    {
      addChunk_PLTE(&outv, &info.color);
    }
    if(state->encoder.force_palette && (info.color.colortype == LCT_RGB || info.color.colortype == LCT_RGBA))
    {
      addChunk_PLTE(&outv, &info.color);
    }
    /*tRNS*/
    if(info.color.colortype == LCT_PALETTE && getPaletteTranslucency(info.color.palette, info.color.palettesize) != 0)
    {
      addChunk_tRNS(&outv, &info.color);
    }
    if((info.color.colortype == LCT_GREY || info.color.colortype == LCT_RGB) && info.color.key_defined)
    {
      addChunk_tRNS(&outv, &info.color);
    }
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*bKGD (must come between PLTE and the IDAt chunks*/
    if(info.background_defined) addChunk_bKGD(&outv, &info);
    /*pHYs (must come before the IDAT chunks)*/
    if(info.phys_defined) addChunk_pHYs(&outv, &info);

    /*unknown chunks between PLTE and IDAT*/
    if(info.unknown_chunks_data[1])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[1], info.unknown_chunks_size[1]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*IDAT (multiple IDAT chunks must be consecutive)*/
    state->error = addChunk_IDAT(&outv, data, datasize, &state->encoder.zlibsettings);
    if(state->error) break;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*tIME*/
    if(info.time_defined) addChunk_tIME(&outv, &info.time);
    /*tEXt and/or zTXt*/
    for(i = 0; i != info.text_num; ++i)
    {
      if(strlen(info.text_keys[i]) > 79)
      {
        state->error = 66; /*text chunk too large*/
        break;
      }
      if(strlen(info.text_keys[i]) < 1)
      {
        state->error = 67; /*text chunk too small*/
        break;
      }
      if(state->encoder.text_compression)
      {
        addChunk_zTXt(&outv, info.text_keys[i], info.text_strings[i], &state->encoder.zlibsettings);
      }
      else
      {
        addChunk_tEXt(&outv, info.text_keys[i], info.text_strings[i]);
      }
    }
    /*LodePNG version id in text chunk*/
    if(state->encoder.add_id)
    {
      unsigned alread_added_id_text = 0;
      for(i = 0; i != info.text_num; ++i)
      {
        if(!strcmp(info.text_keys[i], "LodePNG"))
        {
          alread_added_id_text = 1;
          break;
        }
      }
      if(alread_added_id_text == 0)
      {
        addChunk_tEXt(&outv, "LodePNG", LODEPNG_VERSION_STRING); /*it's shorter as tEXt than as zTXt chunk*/
      }
    }
    /*iTXt*/
    for(i = 0; i != info.itext_num; ++i)
    {
      if(strlen(info.itext_keys[i]) > 79)
      {
        state->error = 66; /*text chunk too large*/
        break;
      }
      if(strlen(info.itext_keys[i]) < 1)
      {
        state->error = 67; /*text chunk too small*/
        break;
      }
      addChunk_iTXt(&outv, state->encoder.text_compression,
                    info.itext_keys[i], info.itext_langtags[i], info.itext_transkeys[i], info.itext_strings[i],
                    &state->encoder.zlibsettings);
    }

    /*unknown chunks between IDAT and IEND*/
    if(info.unknown_chunks_data[2])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[2], info.unknown_chunks_size[2]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    addChunk_IEND(&outv);

    break; /*this isn't really a while loop; no error happened so break out now!*/
  }

  lodepng_info_cleanup(&info);
  lodepng_free(data);
  /*instead of cleaning the vector up, give it to the output*/
  *out = outv.data;
  *outsize = outv.size;

  return state->error;
}